

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  List *pLVar1;
  bool bVar2;
  cmFileLockPool *pcVar3;
  _List_node_base *p_Var4;
  cmFileLockResult result;
  cmFileLockResult local_30;
  
  pcVar3 = this;
  do {
    pcVar3 = (cmFileLockPool *)
             (pcVar3->FunctionScopes).
             super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (pcVar3 == this) goto LAB_002fe52b;
    local_30 = ScopePool::Release((ScopePool *)
                                  (pcVar3->FunctionScopes).
                                  super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                                  ._M_impl._M_node._M_size,filename);
    bVar2 = cmFileLockResult::IsOk(&local_30);
  } while (bVar2);
  if (pcVar3 == this) {
LAB_002fe52b:
    pLVar1 = &this->FileScopes;
    p_Var4 = (_List_node_base *)pLVar1;
    do {
      p_Var4 = (((_List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var4 == (_List_node_base *)pLVar1) goto LAB_002fe562;
      local_30 = ScopePool::Release((ScopePool *)p_Var4[1]._M_next,filename);
      bVar2 = cmFileLockResult::IsOk(&local_30);
    } while (bVar2);
    if (p_Var4 == (_List_node_base *)pLVar1) {
LAB_002fe562:
      local_30 = ScopePool::Release(&this->ProcessScope,filename);
    }
  }
  return local_30;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (It i = this->FunctionScopes.begin();
      i != this->FunctionScopes.end(); ++i)
    {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk())
      {
      return result;
      }
    }

  for (It i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i)
    {
    const cmFileLockResult result = (*i)->Release(filename);
    if (!result.IsOk())
      {
      return result;
      }
    }

  return this->ProcessScope.Release(filename);
}